

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

void __thiscall
nv::FloatImage::applyKernelHorizontal
          (FloatImage *this,PolyphaseKernel *k,int y,uint c,uint a,WrapMode wm,float *output)

{
  int iVar1;
  float fVar2;
  ushort uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int local_58;
  
  uVar8 = (ulong)k->m_length;
  if (uVar8 != 0) {
    uVar4 = k->m_windowSize;
    uVar3 = this->m_width;
    uVar21 = (uint)this->m_height;
    iVar7 = uVar21 * uVar3;
    fVar2 = k->m_width;
    pfVar5 = this->m_mem;
    iVar1 = uVar21 - 1;
    iVar14 = 0;
    if (0 < y) {
      iVar14 = y;
    }
    iVar18 = uVar3 - 1;
    if (iVar1 < iVar14) {
      iVar14 = iVar1;
    }
    uVar20 = (uint)uVar3;
    uVar11 = y;
    if (this->m_height == 1) {
      uVar11 = 0;
    }
    uVar10 = -uVar11;
    if (0 < (int)uVar11) {
      uVar10 = uVar11;
    }
    pfVar6 = k->m_data;
    uVar13 = 0;
    do {
      fVar22 = NAN;
      if (0 < (int)uVar4) {
        fVar23 = floorf(((float)(uVar13 & 0xffffffff) + 0.5) * (1.0 / ((float)uVar8 / (float)uVar3))
                        - fVar2);
        local_58 = (int)uVar13;
        fVar22 = 0.0;
        uVar19 = 0;
        fVar24 = 0.0;
        do {
          uVar17 = uVar19 + (long)(int)fVar23;
          iVar16 = (int)uVar17;
          if (wm == WrapMode_Repeat) {
            if (y < 0) {
              uVar11 = (y + 1) % (int)uVar21 + iVar1;
            }
            else {
              uVar11 = (uint)y % uVar21;
            }
            if ((long)uVar17 < 0) {
              iVar16 = (iVar16 + 1) % (int)uVar20 + iVar18;
            }
            else {
              iVar16 = (int)((uVar17 & 0xffffffff) % (ulong)(uint)uVar3);
            }
            iVar16 = uVar11 * uVar3 + iVar16;
          }
          else if (wm == WrapMode_Clamp) {
            if (iVar16 < 1) {
              iVar16 = 0;
            }
            if (iVar18 < iVar16) {
              iVar16 = iVar18;
            }
            iVar16 = iVar16 + iVar14 * uVar20;
          }
          else {
            uVar17 = uVar17 & 0xffffffff;
            if (uVar3 == 1) {
              uVar17 = 0;
            }
            uVar9 = (ulong)(uint)-(int)uVar17;
            if (0 < (int)uVar17) {
              uVar9 = uVar17;
            }
            while (uVar12 = (uint)uVar9, uVar11 = uVar10, uVar20 <= uVar12) {
              uVar12 = ((uint)uVar3 * 2 + -2) - uVar12;
              uVar11 = -uVar12;
              if (0 < (int)uVar12) {
                uVar11 = uVar12;
              }
              uVar9 = (ulong)uVar11;
            }
            while (uVar21 <= uVar11) {
              uVar15 = (uVar21 * 2 + -2) - uVar11;
              uVar11 = -uVar15;
              if (0 < (int)uVar15) {
                uVar11 = uVar15;
              }
            }
            iVar16 = uVar11 * uVar20 + uVar12;
          }
          fVar25 = (pfVar5[(ulong)(iVar7 * a) + (long)iVar16] + 0.00390625) *
                   pfVar6[uVar4 * local_58 + (int)uVar19];
          fVar24 = fVar24 + fVar25;
          fVar22 = fVar22 + fVar25 * pfVar5[(ulong)(c * iVar7) + (long)iVar16];
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar4);
        fVar22 = fVar22 / fVar24;
      }
      output[uVar13] = fVar22;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar8);
  }
  return;
}

Assistant:

void FloatImage::applyKernelHorizontal(const PolyphaseKernel & k, int y, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_width);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvDebugCheck(right - left <= windowSize);
		
		float norm = 0.0f;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(left + j, y, wm);

			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}